

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

void __thiscall Grid::setslime(Grid *this,point p,bool slime)

{
  refc<cg_other> *this_00;
  pointer *ppcVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  iterator __position;
  cg_box *pcVar6;
  int *piVar7;
  cg_other *this_01;
  cgo_char *pcVar8;
  uint *puVar9;
  ulong uVar10;
  cg_box *this_02;
  cgo_char local_40;
  
  if (-1 < p.x) {
    this_02 = (this->box).ptr;
    iVar2 = this_02->w;
    if ((-1 < (long)p && p.x < iVar2) && (iVar3 = this_02->h, p.y < iVar3)) {
      if (1 < *(this->box).count) {
        pcVar6 = (cg_box *)operator_new(0x10);
        pcVar6->w = iVar2;
        pcVar6->h = iVar3;
        __n = (long)(iVar3 * iVar2) * 4;
        uVar10 = 0xffffffffffffffff;
        if (-1 < iVar3 * iVar2) {
          uVar10 = __n;
        }
        piVar7 = (int *)operator_new__(uVar10);
        pcVar6->data = piVar7;
        memcpy(piVar7,this_02->data,__n);
        refc<cg_box>::decrement(&this->box);
        (this->box).ptr = pcVar6;
        piVar7 = (int *)operator_new(4);
        *piVar7 = 1;
        (this->box).count = piVar7;
        this_02 = pcVar6;
      }
      puVar9 = (uint *)cg_box::at(this_02,p);
      uVar4 = this->SLIMEBIT;
      iVar2 = this->SLIMEBIT_SHIFT;
      uVar5 = *puVar9;
      puVar9 = (uint *)cg_box::at((this->box).ptr,p);
      *puVar9 = (uint)slime << ((byte)iVar2 & 0x1f) | ~uVar4 & uVar5;
      return;
    }
  }
  this_00 = &this->other;
  if (*(this->other).count < 2) {
    this_01 = this_00->ptr;
  }
  else {
    this_01 = (cg_other *)operator_new(0x18);
    std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::vector
              ((vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *)this_01,
               &this_00->ptr->data);
    refc<cg_other>::decrement(this_00);
    (this->other).ptr = this_01;
    piVar7 = (int *)operator_new(4);
    *piVar7 = 1;
    (this->other).count = piVar7;
  }
  pcVar8 = (this_01->data).
           super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this_01->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pcVar8 == __position._M_current) {
      local_40.ch = this->SLIMEBIT | 0x80000000;
      if (__position._M_current ==
          (this_01->data).
          super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_40.p = p;
        std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::
        _M_realloc_insert<cg_other::cgo_char>(&this_01->data,__position,&local_40);
      }
      else {
        (__position._M_current)->ch = local_40.ch;
        (__position._M_current)->p = p;
        ppcVar1 = &(this_01->data).
                   super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      return;
    }
    if (pcVar8->p == p) break;
    pcVar8 = pcVar8 + 1;
  }
  pcVar8->ch = (uint)slime << ((byte)this->SLIMEBIT_SHIFT & 0x1f) | ~this->SLIMEBIT & pcVar8->ch;
  return;
}

Assistant:

void Grid::setslime(point p, bool slime) {
    if (box->contains(p)) {
        uniquify(box);
        box->at(p) = (box->at(p) & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
        return;
    }
    uniquify(other);
    for (auto &d: other->data) {
        if (d.p == p) {
            d.ch = (d.ch & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
            return;
        }
    }
    other->data.push_back({ p, OUT_CHAR | SLIMEBIT });
}